

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O0

Sbl_Man_t * Sbl_ManAlloc(Gia_Man_t *pGia,int Number)

{
  int iVar1;
  Sbl_Man_t *pSVar2;
  sat_solver *psVar3;
  Vec_Int_t *pVVar4;
  Hsh_VecMan_t *pHVar5;
  Vec_Wec_t *pVVar6;
  Vec_Wrd_t *pVVar7;
  Sbl_Man_t *p;
  int Number_local;
  Gia_Man_t *pGia_local;
  
  pSVar2 = (Sbl_Man_t *)calloc(1,0x198);
  pSVar2->nVars = Number;
  iVar1 = Abc_Base2Log(Number);
  pSVar2->LogN = iVar1;
  pSVar2->Power2 = 1 << ((byte)pSVar2->LogN & 0x1f);
  psVar3 = Sbm_AddCardinSolver(pSVar2->LogN,&pSVar2->vCardVars);
  pSVar2->pSat = psVar3;
  iVar1 = sat_solver_nvars(pSVar2->pSat);
  pSVar2->FirstVar = iVar1;
  sat_solver_bookmark(pSVar2->pSat);
  pSVar2->pGia = pGia;
  pVVar4 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vLeaves = pVVar4;
  pVVar4 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vAnds = pVVar4;
  pVVar4 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vNodes = pVVar4;
  pVVar4 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vRoots = pVVar4;
  pVVar4 = Vec_IntAlloc(pSVar2->nVars);
  pSVar2->vRootVars = pVVar4;
  pHVar5 = Hsh_VecManStart(1000);
  pSVar2->pHash = pHVar5;
  pVVar4 = Vec_IntAlloc(0);
  pSVar2->vArrs = pVVar4;
  pVVar4 = Vec_IntAlloc(0);
  pSVar2->vReqs = pVVar4;
  pVVar6 = Vec_WecAlloc(0x80);
  pSVar2->vWindow = pVVar6;
  pVVar4 = Vec_IntAlloc(0x20);
  pSVar2->vPath = pVVar4;
  pVVar4 = Vec_IntAlloc(0x20);
  pSVar2->vEdges = pVVar4;
  pVVar7 = Vec_WrdAlloc(1000);
  pSVar2->vCutsI1 = pVVar7;
  pVVar7 = Vec_WrdAlloc(1000);
  pSVar2->vCutsI2 = pVVar7;
  pVVar7 = Vec_WrdAlloc(1000);
  pSVar2->vCutsN1 = pVVar7;
  pVVar7 = Vec_WrdAlloc(1000);
  pSVar2->vCutsN2 = pVVar7;
  pVVar4 = Vec_IntAlloc(0x40);
  pSVar2->vCutsNum = pVVar4;
  pVVar4 = Vec_IntAlloc(0x40);
  pSVar2->vCutsStart = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pSVar2->vCutsObj = pVVar4;
  pVVar4 = Vec_IntAlloc(0x40);
  pSVar2->vSolInit = pVVar4;
  pVVar4 = Vec_IntAlloc(0x40);
  pSVar2->vSolCur = pVVar4;
  pVVar4 = Vec_IntAlloc(0x40);
  pSVar2->vSolBest = pVVar4;
  pVVar7 = Vec_WrdAlloc(0x20);
  pSVar2->vTempI1 = pVVar7;
  pVVar7 = Vec_WrdAlloc(0x20);
  pSVar2->vTempI2 = pVVar7;
  pVVar7 = Vec_WrdAlloc(0x20);
  pSVar2->vTempN1 = pVVar7;
  pVVar7 = Vec_WrdAlloc(0x20);
  pSVar2->vTempN2 = pVVar7;
  pVVar4 = Vec_IntAlloc(0x40);
  pSVar2->vLits = pVVar4;
  pVVar4 = Vec_IntAlloc(0x40);
  pSVar2->vAssump = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pSVar2->vPolar = pVVar4;
  Gia_ManFillValue(pGia);
  return pSVar2;
}

Assistant:

Sbl_Man_t * Sbl_ManAlloc( Gia_Man_t * pGia, int Number )
{
    Sbl_Man_t * p = ABC_CALLOC( Sbl_Man_t, 1 );
    p->nVars      = Number;
    p->LogN       = Abc_Base2Log(Number);
    p->Power2     = 1 << p->LogN;
    p->pSat       = Sbm_AddCardinSolver( p->LogN, &p->vCardVars );
    p->FirstVar   = sat_solver_nvars( p->pSat );
    sat_solver_bookmark( p->pSat );
    // window
    p->pGia       = pGia;
    p->vLeaves    = Vec_IntAlloc( p->nVars );
    p->vAnds      = Vec_IntAlloc( p->nVars );
    p->vNodes     = Vec_IntAlloc( p->nVars );
    p->vRoots     = Vec_IntAlloc( p->nVars );
    p->vRootVars  = Vec_IntAlloc( p->nVars );
    p->pHash      = Hsh_VecManStart( 1000 );
    // timing
    p->vArrs      = Vec_IntAlloc( 0 );
    p->vReqs      = Vec_IntAlloc( 0 );
    p->vWindow    = Vec_WecAlloc( 128 );
    p->vPath      = Vec_IntAlloc( 32 );
    p->vEdges     = Vec_IntAlloc( 32 );
    // cuts
    p->vCutsI1    = Vec_WrdAlloc( 1000 );     // input bit patterns
    p->vCutsI2    = Vec_WrdAlloc( 1000 );     // input bit patterns
    p->vCutsN1    = Vec_WrdAlloc( 1000 );     // node bit patterns
    p->vCutsN2    = Vec_WrdAlloc( 1000 );     // node bit patterns
    p->vCutsNum   = Vec_IntAlloc( 64 );       // cut counts for each obj
    p->vCutsStart = Vec_IntAlloc( 64 );       // starting cuts for each obj
    p->vCutsObj   = Vec_IntAlloc( 1000 );
    p->vSolInit   = Vec_IntAlloc( 64 );
    p->vSolCur    = Vec_IntAlloc( 64 );
    p->vSolBest   = Vec_IntAlloc( 64 );
    p->vTempI1    = Vec_WrdAlloc( 32 ); 
    p->vTempI2    = Vec_WrdAlloc( 32 ); 
    p->vTempN1    = Vec_WrdAlloc( 32 ); 
    p->vTempN2    = Vec_WrdAlloc( 32 ); 
    // internal
    p->vLits      = Vec_IntAlloc( 64 );
    p->vAssump    = Vec_IntAlloc( 64 );
    p->vPolar     = Vec_IntAlloc( 1000 );
    // other
    Gia_ManFillValue( pGia );
    return p;
}